

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uchriter.cpp
# Opt level: O2

UBool __thiscall
icu_63::UCharCharacterIterator::operator==
          (UCharCharacterIterator *this,ForwardCharacterIterator *that)

{
  bool bVar1;
  
  if (this != (UCharCharacterIterator *)that) {
    bVar1 = std::type_info::operator!=
                      ((type_info *)
                       (this->super_CharacterIterator).super_ForwardCharacterIterator.super_UObject.
                       _vptr_UObject[-1],(type_info *)(that->super_UObject)._vptr_UObject[-1]);
    if ((((bVar1) || ((_func_int **)this->text != that[3].super_UObject._vptr_UObject)) ||
        ((this->super_CharacterIterator).textLength != *(int *)&that[1].super_UObject._vptr_UObject)
        ) || (((this->super_CharacterIterator).pos !=
               *(int *)((long)&that[1].super_UObject._vptr_UObject + 4) ||
              ((this->super_CharacterIterator).begin != *(int *)&that[2].super_UObject._vptr_UObject
              )))) {
      bVar1 = false;
    }
    else {
      bVar1 = (this->super_CharacterIterator).end ==
              *(int *)((long)&that[2].super_UObject._vptr_UObject + 4);
    }
    return bVar1;
  }
  return '\x01';
}

Assistant:

UBool
UCharCharacterIterator::operator==(const ForwardCharacterIterator& that) const {
    if (this == &that) {
        return TRUE;
    }
    if (typeid(*this) != typeid(that)) {
        return FALSE;
    }

    UCharCharacterIterator&    realThat = (UCharCharacterIterator&)that;

    return text == realThat.text
        && textLength == realThat.textLength
        && pos == realThat.pos
        && begin == realThat.begin
        && end == realThat.end;
}